

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O3

void swrenderer::R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  bool bVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  short sVar6;
  long lVar7;
  short *psVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar47;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int iVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  long lVar55;
  undefined1 in_XMM5 [16];
  undefined1 auVar56 [16];
  long lVar59;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar77;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar83;
  int iVar84;
  int iVar87;
  undefined1 auVar85 [16];
  int iVar88;
  undefined1 auVar86 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar90 [16];
  double dVar91;
  undefined1 auVar92 [16];
  int y_1;
  int y;
  int xr;
  int local_84;
  uint local_80;
  int local_7c;
  short *local_78;
  ulong local_70;
  int local_64;
  double local_60;
  short *local_58;
  int local_50;
  uint local_4c;
  long local_48;
  long local_40;
  long local_38;
  
  plVar2 = basecolormap;
  auVar92 = _DAT_005d6f80;
  auVar82 = _DAT_005d6240;
  dVar91 = (double)((float)(~x1 + x2) * rw_lightstep + rw_light);
  uVar10 = (uint)uclip[(long)x2 + -1];
  uVar15 = (uint)dclip[(long)x2 + -1];
  dVar16 = 24.0;
  if (dVar91 <= 24.0) {
    dVar16 = dVar91;
  }
  iVar3 = wallshade - SUB84(dVar16 + 103079215104.0,0) >> 0x10;
  iVar84 = 0x1f;
  if (iVar3 < 0x1f) {
    iVar84 = iVar3;
  }
  iVar3 = 0;
  if (0 < iVar84) {
    iVar3 = iVar84;
  }
  local_48 = *basecolormap;
  if (uclip[(long)x2 + -1] < dclip[(long)x2 + -1]) {
    sVar6 = (short)x2 + -1;
    lVar11 = (ulong)(uVar15 - uVar10) - 1;
    auVar17._8_4_ = (int)lVar11;
    auVar17._0_8_ = lVar11;
    auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = (long)(int)uVar10 * 2;
    uVar12 = 0;
    auVar17 = auVar17 ^ _DAT_005d6240;
    in_XMM6._8_4_ = 0xffffffff;
    in_XMM6._0_8_ = 0xffffffffffffffff;
    in_XMM6._12_4_ = 0xffffffff;
    auVar21 = _DAT_005d6f50;
    auVar28 = _DAT_005d6f60;
    auVar57 = _DAT_005d6f70;
    auVar66 = _DAT_005d6230;
    do {
      auVar70 = auVar66 ^ auVar82;
      iVar84 = auVar17._0_4_;
      iVar83 = -(uint)(iVar84 < auVar70._0_4_);
      iVar47 = auVar17._4_4_;
      auVar71._4_4_ = -(uint)(iVar47 < auVar70._4_4_);
      iVar88 = auVar17._8_4_;
      iVar87 = -(uint)(iVar88 < auVar70._8_4_);
      iVar48 = auVar17._12_4_;
      auVar71._12_4_ = -(uint)(iVar48 < auVar70._12_4_);
      auVar80._4_4_ = iVar83;
      auVar80._0_4_ = iVar83;
      auVar80._8_4_ = iVar87;
      auVar80._12_4_ = iVar87;
      auVar89 = pshuflw(in_XMM11,auVar80,0xe8);
      auVar78._4_4_ = -(uint)(auVar70._4_4_ == iVar47);
      auVar78._12_4_ = -(uint)(auVar70._12_4_ == iVar48);
      auVar78._0_4_ = auVar78._4_4_;
      auVar78._8_4_ = auVar78._12_4_;
      auVar90 = pshuflw(in_XMM12,auVar78,0xe8);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar70 = pshuflw(auVar89,auVar71,0xe8);
      auVar70 = (auVar70 | auVar90 & auVar89) ^ in_XMM6;
      auVar70 = packssdw(auVar70,auVar70);
      if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        spanend[(long)(int)uVar10 + uVar12] = sVar6;
      }
      auVar71 = auVar78 & auVar80 | auVar71;
      auVar70 = packssdw(auVar71,auVar71);
      auVar70 = packssdw(auVar70 ^ in_XMM6,auVar70 ^ in_XMM6);
      if ((auVar70._0_4_ >> 0x10 & 1) != 0) {
        *(short *)(lVar11 + 0x1789f92 + uVar12 * 2) = sVar6;
      }
      auVar78 = auVar57 ^ auVar82;
      iVar83 = -(uint)(iVar84 < auVar78._0_4_);
      auVar85._4_4_ = -(uint)(iVar47 < auVar78._4_4_);
      iVar87 = -(uint)(iVar88 < auVar78._8_4_);
      auVar85._12_4_ = -(uint)(iVar48 < auVar78._12_4_);
      auVar70._4_4_ = iVar83;
      auVar70._0_4_ = iVar83;
      auVar70._8_4_ = iVar87;
      auVar70._12_4_ = iVar87;
      auVar79._4_4_ = -(uint)(auVar78._4_4_ == iVar47);
      auVar79._12_4_ = -(uint)(auVar78._12_4_ == iVar48);
      auVar79._0_4_ = auVar79._4_4_;
      auVar79._8_4_ = auVar79._12_4_;
      auVar85._0_4_ = auVar85._4_4_;
      auVar85._8_4_ = auVar85._12_4_;
      auVar78 = auVar79 & auVar70 | auVar85;
      auVar78 = packssdw(auVar78,auVar78);
      auVar78 = packssdw(auVar78 ^ in_XMM6,auVar78 ^ in_XMM6);
      if ((auVar78 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(lVar11 + 0x1789f94 + uVar12 * 2) = sVar6;
      }
      auVar70 = pshufhw(auVar70,auVar70,0x84);
      auVar80 = pshufhw(auVar79,auVar79,0x84);
      auVar71 = pshufhw(auVar70,auVar85,0x84);
      auVar70 = (auVar71 | auVar80 & auVar70) ^ in_XMM6;
      auVar70 = packssdw(auVar70,auVar70);
      if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(lVar11 + 0x1789f96 + uVar12 * 2) = sVar6;
      }
      auVar70 = auVar28 ^ auVar82;
      iVar83 = -(uint)(iVar84 < auVar70._0_4_);
      auVar73._4_4_ = -(uint)(iVar47 < auVar70._4_4_);
      iVar87 = -(uint)(iVar88 < auVar70._8_4_);
      auVar73._12_4_ = -(uint)(iVar48 < auVar70._12_4_);
      auVar81._4_4_ = iVar83;
      auVar81._0_4_ = iVar83;
      auVar81._8_4_ = iVar87;
      auVar81._12_4_ = iVar87;
      auVar78 = pshuflw(auVar78,auVar81,0xe8);
      auVar72._4_4_ = -(uint)(auVar70._4_4_ == iVar47);
      auVar72._12_4_ = -(uint)(auVar70._12_4_ == iVar48);
      auVar72._0_4_ = auVar72._4_4_;
      auVar72._8_4_ = auVar72._12_4_;
      auVar70 = pshuflw(auVar90 & auVar89,auVar72,0xe8);
      in_XMM12 = auVar70 & auVar78;
      auVar73._0_4_ = auVar73._4_4_;
      auVar73._8_4_ = auVar73._12_4_;
      auVar70 = pshuflw(auVar78,auVar73,0xe8);
      auVar70 = (auVar70 | in_XMM12) ^ in_XMM6;
      auVar70 = packssdw(auVar70,auVar70);
      if ((auVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(short *)(lVar11 + 0x1789f98 + uVar12 * 2) = sVar6;
      }
      auVar73 = auVar72 & auVar81 | auVar73;
      auVar70 = packssdw(auVar73,auVar73);
      auVar70 = packssdw(auVar70 ^ in_XMM6,auVar70 ^ in_XMM6);
      if ((auVar70 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(short *)(lVar11 + 0x1789f9a + uVar12 * 2) = sVar6;
      }
      auVar70 = auVar21 ^ auVar82;
      iVar84 = -(uint)(iVar84 < auVar70._0_4_);
      auVar86._4_4_ = -(uint)(iVar47 < auVar70._4_4_);
      iVar88 = -(uint)(iVar88 < auVar70._8_4_);
      auVar86._12_4_ = -(uint)(iVar48 < auVar70._12_4_);
      auVar89._4_4_ = iVar84;
      auVar89._0_4_ = iVar84;
      auVar89._8_4_ = iVar88;
      auVar89._12_4_ = iVar88;
      auVar90._4_4_ = -(uint)(auVar70._4_4_ == iVar47);
      auVar90._12_4_ = -(uint)(auVar70._12_4_ == iVar48);
      auVar90._0_4_ = auVar90._4_4_;
      auVar90._8_4_ = auVar90._12_4_;
      auVar86._0_4_ = auVar86._4_4_;
      auVar86._8_4_ = auVar86._12_4_;
      auVar70 = auVar90 & auVar89 | auVar86;
      auVar70 = packssdw(auVar70,auVar70);
      in_XMM11 = packssdw(auVar70 ^ in_XMM6,auVar70 ^ in_XMM6);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(short *)(lVar11 + 0x1789f9c + uVar12 * 2) = sVar6;
      }
      auVar70 = pshufhw(auVar89,auVar89,0x84);
      auVar78 = pshufhw(auVar90,auVar90,0x84);
      in_XMM9 = auVar78 & auVar70;
      auVar70 = pshufhw(auVar70,auVar86,0x84);
      auVar70 = (auVar70 | in_XMM9) ^ in_XMM6;
      auVar70 = packssdw(auVar70,auVar70);
      if ((auVar70 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(short *)(lVar11 + 0x1789f9e + uVar12 * 2) = sVar6;
      }
      uVar12 = uVar12 + 8;
      lVar14 = auVar66._8_8_;
      lVar7 = auVar92._0_8_;
      auVar66._0_8_ = auVar66._0_8_ + lVar7;
      lVar55 = auVar92._8_8_;
      auVar66._8_8_ = lVar14 + lVar55;
      lVar14 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + lVar7;
      auVar57._8_8_ = lVar14 + lVar55;
      lVar14 = auVar28._8_8_;
      auVar28._0_8_ = auVar28._0_8_ + lVar7;
      auVar28._8_8_ = lVar14 + lVar55;
      lVar14 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + lVar7;
      auVar21._8_8_ = lVar14 + lVar55;
      in_XMM5 = auVar82;
      in_XMM7 = auVar92;
    } while (((ulong)(uVar15 - uVar10) + 7 & 0x1fffffff8) != uVar12);
  }
  drawerargs::dc_colormap = local_48 + (ulong)(uint)(iVar3 << 8);
  local_50 = x1;
  if (x1 <= x2 + -2) {
    local_40 = (ulong)(uint)(iVar3 << 8) + *plVar2;
    local_38 = (long)x1;
    auVar74._8_4_ = 0xffffffff;
    auVar74._0_8_ = 0xffffffffffffffff;
    auVar74._12_4_ = 0xffffffff;
    lVar11 = (long)(x2 + -2);
    auVar82 = _DAT_005d6240;
    auVar92 = _DAT_005d6f50;
    auVar21 = _DAT_005d6f60;
    local_78 = dclip;
    local_58 = uclip;
    do {
      uVar12 = (ulong)uVar15;
      uVar13 = (uint)local_58[lVar11];
      uVar4 = (uint)local_78[lVar11];
      local_70 = (ulong)uVar4;
      local_7c = (int)lVar11 + 1;
      dVar91 = dVar91 - (double)rw_lightstep;
      dVar16 = dVar91;
      if (24.0 <= dVar91) {
        dVar16 = 24.0;
      }
      iVar47 = SUB84(dVar16 + 103079215104.0,0);
      iVar84 = wallshade - iVar47 >> 0x10;
      if (0x1e < iVar84) {
        iVar84 = 0x1f;
      }
      if (iVar84 < 1) {
        iVar84 = 0;
      }
      sVar6 = (short)lVar11;
      if (iVar84 == iVar3) {
        uVar5 = uVar15;
        if ((int)uVar13 < (int)uVar15) {
          uVar5 = uVar13;
        }
        local_64 = iVar3;
        if (local_40 == local_48) {
          if ((int)uVar10 <= (int)uVar5) {
            uVar10 = uVar5;
          }
          uVar5 = uVar10;
          if ((int)uVar10 < (int)uVar4) {
            uVar5 = uVar4;
          }
          if ((int)uVar5 <= (int)uVar15) {
            uVar12 = (ulong)uVar5;
          }
        }
        else {
          local_60 = dVar91;
          if ((int)uVar10 < (int)uVar5) {
            psVar8 = spanend + (int)uVar10;
            lVar14 = (long)(int)uVar5 - (long)(int)uVar10;
            local_4c = uVar13;
            do {
              local_80 = uVar10;
              DrawerCommandQueue::
              QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                        ((int *)&local_80,&local_7c,psVar8);
              psVar8 = psVar8 + 1;
              uVar10 = uVar10 + 1;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            auVar74._8_4_ = 0xffffffff;
            auVar74._0_8_ = 0xffffffffffffffff;
            auVar74._12_4_ = 0xffffffff;
            uVar4 = (uint)local_70;
            auVar82 = _DAT_005d6240;
            auVar92 = _DAT_005d6f50;
            auVar21 = _DAT_005d6f60;
            uVar10 = uVar5;
            uVar13 = local_4c;
          }
          uVar5 = uVar10;
          if ((int)uVar10 < (int)uVar4) {
            uVar5 = uVar4;
          }
          dVar91 = local_60;
          if ((int)uVar5 < (int)uVar15) {
            uVar12 = (ulong)(int)uVar15;
            psVar8 = spanend + uVar12;
            do {
              psVar8 = psVar8 + -1;
              uVar12 = uVar12 - 1;
              local_84 = (int)uVar12;
              DrawerCommandQueue::
              QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                        (&local_84,&local_7c,psVar8);
            } while ((long)(int)uVar5 < (long)uVar12);
            auVar74._8_4_ = 0xffffffff;
            auVar74._0_8_ = 0xffffffffffffffff;
            auVar74._12_4_ = 0xffffffff;
            uVar4 = (uint)local_70;
            auVar82 = _DAT_005d6240;
            dVar91 = local_60;
            auVar92 = _DAT_005d6f50;
            auVar21 = _DAT_005d6f60;
          }
        }
        uVar15 = uVar4;
        if ((int)uVar10 < (int)uVar4) {
          uVar15 = uVar10;
        }
        if ((int)uVar13 < (int)uVar15) {
          lVar7 = (long)(int)uVar13;
          lVar14 = ((int)uVar15 - lVar7) + -1;
          auVar19._8_4_ = (int)lVar14;
          auVar19._0_8_ = lVar14;
          auVar19._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = lVar7 * 2;
          auVar19 = auVar19 ^ auVar82;
          uVar9 = 0;
          do {
            auVar23._8_4_ = (int)uVar9;
            auVar23._0_8_ = uVar9;
            auVar23._12_4_ = (int)(uVar9 >> 0x20);
            auVar28 = (auVar23 | _DAT_005d6230) ^ auVar82;
            iVar84 = auVar19._0_4_;
            iVar48 = -(uint)(iVar84 < auVar28._0_4_);
            iVar3 = auVar19._4_4_;
            auVar30._4_4_ = -(uint)(iVar3 < auVar28._4_4_);
            iVar47 = auVar19._8_4_;
            iVar83 = -(uint)(iVar47 < auVar28._8_4_);
            iVar88 = auVar19._12_4_;
            auVar30._12_4_ = -(uint)(iVar88 < auVar28._12_4_);
            auVar37._4_4_ = iVar48;
            auVar37._0_4_ = iVar48;
            auVar37._8_4_ = iVar83;
            auVar37._12_4_ = iVar83;
            auVar57 = pshuflw(in_XMM5,auVar37,0xe8);
            auVar29._4_4_ = -(uint)(auVar28._4_4_ == iVar3);
            auVar29._12_4_ = -(uint)(auVar28._12_4_ == iVar88);
            auVar29._0_4_ = auVar29._4_4_;
            auVar29._8_4_ = auVar29._12_4_;
            auVar66 = pshuflw(in_XMM6,auVar29,0xe8);
            auVar30._0_4_ = auVar30._4_4_;
            auVar30._8_4_ = auVar30._12_4_;
            auVar28 = pshuflw(auVar57,auVar30,0xe8);
            auVar28 = (auVar28 | auVar66 & auVar57) ^ auVar74;
            auVar28 = packssdw(auVar28,auVar28);
            if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              spanend[lVar7 + uVar9] = sVar6;
            }
            auVar30 = auVar29 & auVar37 | auVar30;
            auVar28 = packssdw(auVar30,auVar30);
            auVar28 = packssdw(auVar28 ^ auVar74,auVar28 ^ auVar74);
            if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
              *(short *)(lVar14 + 0x1789f92 + uVar9 * 2) = sVar6;
            }
            auVar28 = (auVar23 | _DAT_005d6f70) ^ auVar82;
            iVar48 = -(uint)(iVar84 < auVar28._0_4_);
            auVar50._4_4_ = -(uint)(iVar3 < auVar28._4_4_);
            iVar83 = -(uint)(iVar47 < auVar28._8_4_);
            auVar50._12_4_ = -(uint)(iVar88 < auVar28._12_4_);
            auVar31._4_4_ = iVar48;
            auVar31._0_4_ = iVar48;
            auVar31._8_4_ = iVar83;
            auVar31._12_4_ = iVar83;
            auVar38._4_4_ = -(uint)(auVar28._4_4_ == iVar3);
            auVar38._12_4_ = -(uint)(auVar28._12_4_ == iVar88);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar50._0_4_ = auVar50._4_4_;
            auVar50._8_4_ = auVar50._12_4_;
            auVar28 = auVar38 & auVar31 | auVar50;
            auVar28 = packssdw(auVar28,auVar28);
            auVar28 = packssdw(auVar28 ^ auVar74,auVar28 ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f94 + uVar9 * 2) = sVar6;
            }
            auVar17 = pshufhw(auVar31,auVar31,0x84);
            auVar78 = pshufhw(auVar38,auVar38,0x84);
            auVar70 = pshufhw(auVar17,auVar50,0x84);
            auVar17 = (auVar70 | auVar78 & auVar17) ^ auVar74;
            auVar17 = packssdw(auVar17,auVar17);
            if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f96 + uVar9 * 2) = sVar6;
            }
            auVar17 = (auVar23 | auVar21) ^ auVar82;
            iVar48 = -(uint)(iVar84 < auVar17._0_4_);
            auVar33._4_4_ = -(uint)(iVar3 < auVar17._4_4_);
            iVar83 = -(uint)(iVar47 < auVar17._8_4_);
            auVar33._12_4_ = -(uint)(iVar88 < auVar17._12_4_);
            auVar39._4_4_ = iVar48;
            auVar39._0_4_ = iVar48;
            auVar39._8_4_ = iVar83;
            auVar39._12_4_ = iVar83;
            auVar28 = pshuflw(auVar28,auVar39,0xe8);
            auVar32._4_4_ = -(uint)(auVar17._4_4_ == iVar3);
            auVar32._12_4_ = -(uint)(auVar17._12_4_ == iVar88);
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            auVar57 = pshuflw(auVar66 & auVar57,auVar32,0xe8);
            in_XMM6 = auVar57 & auVar28;
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar28 = pshuflw(auVar28,auVar33,0xe8);
            auVar28 = (auVar28 | in_XMM6) ^ auVar74;
            in_XMM5 = packssdw(auVar28,auVar28);
            if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f98 + uVar9 * 2) = sVar6;
            }
            auVar33 = auVar32 & auVar39 | auVar33;
            auVar28 = packssdw(auVar33,auVar33);
            auVar28 = packssdw(auVar28 ^ auVar74,auVar28 ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f9a + uVar9 * 2) = sVar6;
            }
            auVar28 = (auVar23 | auVar92) ^ auVar82;
            iVar84 = -(uint)(iVar84 < auVar28._0_4_);
            auVar40._4_4_ = -(uint)(iVar3 < auVar28._4_4_);
            iVar47 = -(uint)(iVar47 < auVar28._8_4_);
            auVar40._12_4_ = -(uint)(iVar88 < auVar28._12_4_);
            auVar34._4_4_ = iVar84;
            auVar34._0_4_ = iVar84;
            auVar34._8_4_ = iVar47;
            auVar34._12_4_ = iVar47;
            auVar24._4_4_ = -(uint)(auVar28._4_4_ == iVar3);
            auVar24._12_4_ = -(uint)(auVar28._12_4_ == iVar88);
            auVar24._0_4_ = auVar24._4_4_;
            auVar24._8_4_ = auVar24._12_4_;
            auVar40._0_4_ = auVar40._4_4_;
            auVar40._8_4_ = auVar40._12_4_;
            auVar28 = auVar24 & auVar34 | auVar40;
            auVar28 = packssdw(auVar28,auVar28);
            auVar28 = packssdw(auVar28 ^ auVar74,auVar28 ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f9c + uVar9 * 2) = sVar6;
            }
            auVar57 = pshufhw(auVar34,auVar34,0x84);
            auVar28 = pshufhw(auVar24,auVar24,0x84);
            auVar66 = pshufhw(auVar57,auVar40,0x84);
            auVar28 = packssdw(auVar28 & auVar57,(auVar66 | auVar28 & auVar57) ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f9e + uVar9 * 2) = sVar6;
            }
            uVar9 = uVar9 + 8;
          } while ((((int)uVar15 - lVar7) + 7U & 0xfffffffffffffff8) != uVar9);
        }
        if ((int)uVar10 < (int)(uint)uVar12) {
          uVar10 = (uint)uVar12;
        }
        iVar3 = local_64;
        if ((int)uVar10 < (int)uVar4) {
          lVar14 = (long)(int)uVar4;
          lVar7 = (lVar14 - (int)uVar10) + -1;
          auVar20._8_4_ = (int)lVar7;
          auVar20._0_8_ = lVar7;
          auVar20._12_4_ = (int)((ulong)lVar7 >> 0x20);
          psVar8 = (short *)(&DAT_01789f8e + lVar14 * 2);
          uVar12 = 0;
          do {
            auVar25._8_4_ = (int)uVar12;
            auVar25._0_8_ = uVar12;
            auVar25._12_4_ = (int)(uVar12 >> 0x20);
            auVar28 = auVar20 ^ auVar82;
            auVar57 = (auVar25 | _DAT_005d6230) ^ auVar82;
            iVar84 = auVar28._0_4_;
            iVar83 = -(uint)(iVar84 < auVar57._0_4_);
            iVar47 = auVar28._4_4_;
            auVar42._4_4_ = -(uint)(iVar47 < auVar57._4_4_);
            iVar88 = auVar28._8_4_;
            iVar87 = -(uint)(iVar88 < auVar57._8_4_);
            iVar48 = auVar28._12_4_;
            auVar42._12_4_ = -(uint)(iVar48 < auVar57._12_4_);
            auVar51._4_4_ = iVar83;
            auVar51._0_4_ = iVar83;
            auVar51._8_4_ = iVar87;
            auVar51._12_4_ = iVar87;
            auVar28 = pshuflw(in_XMM6,auVar51,0xe8);
            auVar41._4_4_ = -(uint)(auVar57._4_4_ == iVar47);
            auVar41._12_4_ = -(uint)(auVar57._12_4_ == iVar48);
            auVar41._0_4_ = auVar41._4_4_;
            auVar41._8_4_ = auVar41._12_4_;
            auVar66 = pshuflw(in_XMM7,auVar41,0xe8);
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar57 = pshuflw(auVar28,auVar42,0xe8);
            auVar57 = (auVar57 | auVar66 & auVar28) ^ auVar74;
            auVar57 = packssdw(auVar57,auVar57);
            if ((auVar57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *psVar8 = sVar6;
            }
            auVar42 = auVar41 & auVar51 | auVar42;
            auVar57 = packssdw(auVar42,auVar42);
            auVar57 = packssdw(auVar57 ^ auVar74,auVar57 ^ auVar74);
            if ((auVar57._0_4_ >> 0x10 & 1) != 0) {
              psVar8[-1] = sVar6;
            }
            auVar57 = (auVar25 | _DAT_005d6f70) ^ auVar82;
            iVar83 = -(uint)(iVar84 < auVar57._0_4_);
            auVar58._4_4_ = -(uint)(iVar47 < auVar57._4_4_);
            iVar87 = -(uint)(iVar88 < auVar57._8_4_);
            auVar58._12_4_ = -(uint)(iVar48 < auVar57._12_4_);
            auVar43._4_4_ = iVar83;
            auVar43._0_4_ = iVar83;
            auVar43._8_4_ = iVar87;
            auVar43._12_4_ = iVar87;
            auVar52._4_4_ = -(uint)(auVar57._4_4_ == iVar47);
            auVar52._12_4_ = -(uint)(auVar57._12_4_ == iVar48);
            auVar52._0_4_ = auVar52._4_4_;
            auVar52._8_4_ = auVar52._12_4_;
            auVar58._0_4_ = auVar58._4_4_;
            auVar58._8_4_ = auVar58._12_4_;
            auVar57 = auVar52 & auVar43 | auVar58;
            auVar57 = packssdw(auVar57,auVar57);
            auVar57 = packssdw(auVar57 ^ auVar74,auVar57 ^ auVar74);
            if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              psVar8[-2] = sVar6;
            }
            auVar17 = pshufhw(auVar43,auVar43,0x84);
            auVar78 = pshufhw(auVar52,auVar52,0x84);
            auVar70 = pshufhw(auVar17,auVar58,0x84);
            auVar17 = (auVar70 | auVar78 & auVar17) ^ auVar74;
            auVar17 = packssdw(auVar17,auVar17);
            if ((auVar17 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              psVar8[-3] = sVar6;
            }
            auVar17 = (auVar25 | auVar21) ^ auVar82;
            iVar83 = -(uint)(iVar84 < auVar17._0_4_);
            auVar45._4_4_ = -(uint)(iVar47 < auVar17._4_4_);
            iVar87 = -(uint)(iVar88 < auVar17._8_4_);
            auVar45._12_4_ = -(uint)(iVar48 < auVar17._12_4_);
            auVar53._4_4_ = iVar83;
            auVar53._0_4_ = iVar83;
            auVar53._8_4_ = iVar87;
            auVar53._12_4_ = iVar87;
            auVar57 = pshuflw(auVar57,auVar53,0xe8);
            auVar44._4_4_ = -(uint)(auVar17._4_4_ == iVar47);
            auVar44._12_4_ = -(uint)(auVar17._12_4_ == iVar48);
            auVar44._0_4_ = auVar44._4_4_;
            auVar44._8_4_ = auVar44._12_4_;
            auVar28 = pshuflw(auVar66 & auVar28,auVar44,0xe8);
            in_XMM7 = auVar28 & auVar57;
            auVar45._0_4_ = auVar45._4_4_;
            auVar45._8_4_ = auVar45._12_4_;
            auVar28 = pshuflw(auVar57,auVar45,0xe8);
            auVar28 = (auVar28 | in_XMM7) ^ auVar74;
            in_XMM6 = packssdw(auVar28,auVar28);
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              psVar8[-4] = sVar6;
            }
            auVar45 = auVar44 & auVar53 | auVar45;
            auVar28 = packssdw(auVar45,auVar45);
            auVar28 = packssdw(auVar28 ^ auVar74,auVar28 ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              psVar8[-5] = sVar6;
            }
            auVar28 = (auVar25 | auVar92) ^ auVar82;
            auVar54._0_4_ = -(uint)(iVar84 < auVar28._0_4_);
            auVar54._4_4_ = -(uint)(iVar47 < auVar28._4_4_);
            auVar54._8_4_ = -(uint)(iVar88 < auVar28._8_4_);
            auVar54._12_4_ = -(uint)(iVar48 < auVar28._12_4_);
            auVar46._4_4_ = auVar54._0_4_;
            auVar46._0_4_ = auVar54._0_4_;
            auVar46._8_4_ = auVar54._8_4_;
            auVar46._12_4_ = auVar54._8_4_;
            auVar26._4_4_ = -(uint)(auVar28._4_4_ == iVar47);
            auVar26._12_4_ = -(uint)(auVar28._12_4_ == iVar48);
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._12_4_;
            auVar35._4_4_ = auVar54._4_4_;
            auVar35._0_4_ = auVar54._4_4_;
            auVar35._8_4_ = auVar54._12_4_;
            auVar35._12_4_ = auVar54._12_4_;
            in_XMM5 = auVar26 & auVar46 | auVar35;
            auVar28 = packssdw(auVar54,in_XMM5);
            auVar28 = packssdw(auVar28 ^ auVar74,auVar28 ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              psVar8[-6] = sVar6;
            }
            auVar66 = pshufhw(auVar46,auVar46,0x84);
            auVar28 = pshufhw(auVar26,auVar26,0x84);
            auVar57 = pshufhw(auVar35,auVar35,0x84);
            auVar28 = packssdw(auVar28 & auVar66,(auVar57 | auVar28 & auVar66) ^ auVar74);
            if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              psVar8[-7] = sVar6;
            }
            uVar12 = uVar12 + 8;
            psVar8 = psVar8 + -8;
          } while (((lVar14 - (int)uVar10) + 7U & 0xfffffffffffffff8) != uVar12);
        }
      }
      else {
        if (((int)uVar10 < (int)uVar15) && (iVar3 != 0)) {
          local_60 = dVar91;
          R_DrawFogBoundarySection(uVar10,uVar15,local_7c);
          auVar82 = _DAT_005d6240;
          dVar91 = local_60;
          auVar92 = _DAT_005d6f50;
          auVar21 = _DAT_005d6f60;
        }
        if ((int)uVar10 < (int)uVar13) {
          uVar13 = uVar10;
        }
        uVar10 = (uint)local_70;
        if ((int)(uint)local_70 < (int)uVar15) {
          uVar10 = uVar15;
        }
        uVar15 = uVar10 - uVar13;
        if (uVar15 != 0 && (int)uVar13 <= (int)uVar10) {
          lVar14 = (ulong)uVar15 - 1;
          auVar18._8_4_ = (int)lVar14;
          auVar18._0_8_ = lVar14;
          auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = (long)(int)uVar13 * 2;
          uVar12 = 0;
          auVar22 = _DAT_005d6230;
          auVar27 = _DAT_005d6f70;
          auVar36 = auVar21;
          auVar49 = auVar92;
          do {
            auVar28 = auVar18 ^ auVar82;
            auVar57 = auVar22 ^ auVar82;
            iVar3 = auVar28._0_4_;
            iVar87 = -(uint)(iVar3 < auVar57._0_4_);
            iVar88 = auVar28._4_4_;
            auVar61._4_4_ = -(uint)(iVar88 < auVar57._4_4_);
            iVar48 = auVar28._8_4_;
            iVar77 = -(uint)(iVar48 < auVar57._8_4_);
            iVar83 = auVar28._12_4_;
            auVar61._12_4_ = -(uint)(iVar83 < auVar57._12_4_);
            auVar67._4_4_ = iVar87;
            auVar67._0_4_ = iVar87;
            auVar67._8_4_ = iVar77;
            auVar67._12_4_ = iVar77;
            auVar28 = pshuflw(in_XMM9,auVar67,0xe8);
            auVar60._4_4_ = -(uint)(auVar57._4_4_ == iVar88);
            auVar60._12_4_ = -(uint)(auVar57._12_4_ == iVar83);
            auVar60._0_4_ = auVar60._4_4_;
            auVar60._8_4_ = auVar60._12_4_;
            auVar57 = pshuflw(auVar82,auVar60,0xe8);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar82 = pshuflw(auVar28,auVar61,0xe8);
            auVar82 = (auVar82 | auVar57 & auVar28) ^ _DAT_005d7260;
            auVar82 = packssdw(auVar82,auVar82);
            if ((auVar82 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              spanend[(long)(int)uVar13 + uVar12] = sVar6;
            }
            auVar61 = auVar60 & auVar67 | auVar61;
            auVar82 = packssdw(auVar61,auVar61);
            auVar82 = packssdw(auVar82 ^ _DAT_005d7260,auVar82 ^ _DAT_005d7260);
            if ((auVar82._0_4_ >> 0x10 & 1) != 0) {
              *(short *)(lVar14 + 0x1789f92 + uVar12 * 2) = sVar6;
            }
            auVar82 = _DAT_005d6240;
            auVar28 = auVar27 ^ _DAT_005d6240;
            iVar87 = -(uint)(iVar3 < auVar28._0_4_);
            auVar75._4_4_ = -(uint)(iVar88 < auVar28._4_4_);
            iVar77 = -(uint)(iVar48 < auVar28._8_4_);
            auVar75._12_4_ = -(uint)(iVar83 < auVar28._12_4_);
            auVar62._4_4_ = iVar87;
            auVar62._0_4_ = iVar87;
            auVar62._8_4_ = iVar77;
            auVar62._12_4_ = iVar77;
            auVar68._4_4_ = -(uint)(auVar28._4_4_ == iVar88);
            auVar68._12_4_ = -(uint)(auVar28._12_4_ == iVar83);
            auVar68._0_4_ = auVar68._4_4_;
            auVar68._8_4_ = auVar68._12_4_;
            auVar75._0_4_ = auVar75._4_4_;
            auVar75._8_4_ = auVar75._12_4_;
            auVar28 = auVar68 & auVar62 | auVar75;
            auVar28 = packssdw(auVar28,auVar28);
            auVar28 = packssdw(auVar28 ^ _DAT_005d7260,auVar28 ^ _DAT_005d7260);
            if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f94 + uVar12 * 2) = sVar6;
            }
            auVar57 = pshufhw(auVar62,auVar62,0x84);
            auVar17 = pshufhw(auVar68,auVar68,0x84);
            auVar66 = pshufhw(auVar57,auVar75,0x84);
            auVar57 = (auVar66 | auVar17 & auVar57) ^ _DAT_005d7260;
            auVar57 = packssdw(auVar57,auVar57);
            if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f96 + uVar12 * 2) = sVar6;
            }
            auVar57 = auVar36 ^ auVar82;
            iVar87 = -(uint)(iVar3 < auVar57._0_4_);
            auVar64._4_4_ = -(uint)(iVar88 < auVar57._4_4_);
            iVar77 = -(uint)(iVar48 < auVar57._8_4_);
            auVar64._12_4_ = -(uint)(iVar83 < auVar57._12_4_);
            auVar69._4_4_ = iVar87;
            auVar69._0_4_ = iVar87;
            auVar69._8_4_ = iVar77;
            auVar69._12_4_ = iVar77;
            auVar28 = pshuflw(auVar28,auVar69,0xe8);
            auVar63._4_4_ = -(uint)(auVar57._4_4_ == iVar88);
            auVar63._12_4_ = -(uint)(auVar57._12_4_ == iVar83);
            auVar63._0_4_ = auVar63._4_4_;
            auVar63._8_4_ = auVar63._12_4_;
            auVar57 = pshuflw(auVar82,auVar63,0xe8);
            auVar64._0_4_ = auVar64._4_4_;
            auVar64._8_4_ = auVar64._12_4_;
            auVar82 = pshuflw(auVar28,auVar64,0xe8);
            auVar82 = (auVar82 | auVar57 & auVar28) ^ _DAT_005d7260;
            auVar82 = packssdw(auVar82,auVar82);
            if ((auVar82 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f98 + uVar12 * 2) = sVar6;
            }
            auVar64 = auVar63 & auVar69 | auVar64;
            auVar82 = packssdw(auVar64,auVar64);
            auVar82 = packssdw(auVar82 ^ _DAT_005d7260,auVar82 ^ _DAT_005d7260);
            if ((auVar82 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f9a + uVar12 * 2) = sVar6;
            }
            auVar82 = _DAT_005d6240;
            auVar28 = auVar49 ^ _DAT_005d6240;
            auVar76._0_4_ = -(uint)(iVar3 < auVar28._0_4_);
            auVar76._4_4_ = -(uint)(iVar88 < auVar28._4_4_);
            auVar76._8_4_ = -(uint)(iVar48 < auVar28._8_4_);
            auVar76._12_4_ = -(uint)(iVar83 < auVar28._12_4_);
            auVar65._4_4_ = auVar76._0_4_;
            auVar65._0_4_ = auVar76._0_4_;
            auVar65._8_4_ = auVar76._8_4_;
            auVar65._12_4_ = auVar76._8_4_;
            iVar3 = -(uint)(auVar28._4_4_ == iVar88);
            iVar88 = -(uint)(auVar28._12_4_ == iVar83);
            auVar56._4_4_ = iVar3;
            auVar56._0_4_ = iVar3;
            auVar56._8_4_ = iVar88;
            auVar56._12_4_ = iVar88;
            in_XMM7._4_4_ = auVar76._4_4_;
            in_XMM7._0_4_ = auVar76._4_4_;
            in_XMM7._8_4_ = auVar76._12_4_;
            in_XMM7._12_4_ = auVar76._12_4_;
            auVar28 = packssdw(auVar76,auVar56 & auVar65 | in_XMM7);
            in_XMM9._8_4_ = 0xffffffff;
            in_XMM9._0_8_ = 0xffffffffffffffff;
            in_XMM9._12_4_ = 0xffffffff;
            auVar28 = packssdw(auVar28 ^ in_XMM9,auVar28 ^ in_XMM9);
            if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f9c + uVar12 * 2) = sVar6;
            }
            auVar57 = pshufhw(auVar65,auVar65,0x84);
            auVar28 = pshufhw(auVar56,auVar56,0x84);
            auVar66 = pshufhw(auVar57,in_XMM7,0x84);
            in_XMM6 = (auVar66 | auVar28 & auVar57) ^ in_XMM9;
            auVar28 = packssdw(auVar28 & auVar57,in_XMM6);
            if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(short *)(lVar14 + 0x1789f9e + uVar12 * 2) = sVar6;
            }
            uVar12 = uVar12 + 8;
            lVar7 = auVar22._8_8_;
            lVar55 = (long)DAT_005d6f80;
            auVar22._0_8_ = auVar22._0_8_ + lVar55;
            lVar59 = DAT_005d6f80._8_8_;
            auVar22._8_8_ = lVar7 + lVar59;
            lVar7 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + lVar55;
            auVar27._8_8_ = lVar7 + lVar59;
            lVar7 = auVar36._8_8_;
            auVar36._0_8_ = auVar36._0_8_ + lVar55;
            auVar36._8_8_ = lVar7 + lVar59;
            lVar7 = auVar49._8_8_;
            auVar49._0_8_ = auVar49._0_8_ + lVar55;
            auVar49._8_8_ = lVar7 + lVar59;
            in_XMM5 = _DAT_005d6f80;
          } while (((ulong)uVar15 + 7 & 0x1fffffff8) != uVar12);
        }
        dVar16 = (double)(float)dVar91;
        if (24.0 <= (double)(float)dVar91) {
          dVar16 = 24.0;
        }
        iVar3 = wallshade - SUB84(dVar16 + 103079215104.0,0) >> 0x10;
        if (0x1e < iVar3) {
          iVar3 = 0x1f;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        drawerargs::dc_colormap = (ulong)(uint)(iVar3 << 8) + *basecolormap;
        iVar3 = wallshade - iVar47 >> 0x10;
        if (0x1e < iVar3) {
          iVar3 = 0x1f;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        local_40 = (ulong)(uint)(iVar3 << 8) + *basecolormap;
        auVar74._8_4_ = 0xffffffff;
        auVar74._0_8_ = 0xffffffffffffffff;
        auVar74._12_4_ = 0xffffffff;
        iVar3 = iVar84;
      }
      uVar10 = (uint)local_58[lVar11];
      uVar15 = (uint)local_78[lVar11];
      bVar1 = local_38 < lVar11;
      lVar11 = lVar11 + -1;
    } while (bVar1);
  }
  if (((int)uVar10 < (int)uVar15) && (iVar3 != 0)) {
    R_DrawFogBoundarySection(uVar10,uVar15,local_50);
  }
  return;
}

Assistant:

void R_DrawFogBoundary(int x1, int x2, short *uclip, short *dclip)
	{
		// This is essentially the same as R_MapVisPlane but with an extra step
		// to create new horizontal spans whenever the light changes enough that
		// we need to use a new colormap.

		double lightstep = rw_lightstep;
		double light = rw_light + rw_lightstep*(x2 - x1 - 1);
		int x = x2 - 1;
		int t2 = uclip[x];
		int b2 = dclip[x];
		int rcolormap = GETPALOOKUP(light, wallshade);
		int lcolormap;
		uint8_t *basecolormapdata = basecolormap->Maps;

		if (b2 > t2)
		{
			fillshort(spanend + t2, b2 - t2, x);
		}

		R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);

		uint8_t *fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);

		for (--x; x >= x1; --x)
		{
			int t1 = uclip[x];
			int b1 = dclip[x];
			const int xr = x + 1;
			int stop;

			light -= rw_lightstep;
			lcolormap = GETPALOOKUP(light, wallshade);
			if (lcolormap != rcolormap)
			{
				if (t2 < b2 && rcolormap != 0)
				{ // Colormap 0 is always the identity map, so rendering it is
				  // just a waste of time.
					R_DrawFogBoundarySection(t2, b2, xr);
				}
				if (t1 < t2) t2 = t1;
				if (b1 > b2) b2 = b1;
				if (t2 < b2)
				{
					fillshort(spanend + t2, b2 - t2, x);
				}
				rcolormap = lcolormap;
				R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);
				fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);
			}
			else
			{
				if (fake_dc_colormap != basecolormapdata)
				{
					stop = MIN(t1, b2);
					while (t2 < stop)
					{
						int y = t2++;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
					stop = MAX(b1, t2);
					while (b2 > stop)
					{
						int y = --b2;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
				}
				else
				{
					t2 = MAX(t2, MIN(t1, b2));
					b2 = MIN(b2, MAX(b1, t2));
				}

				stop = MIN(t2, b1);
				while (t1 < stop)
				{
					spanend[t1++] = x;
				}
				stop = MAX(b2, t2);
				while (b1 > stop)
				{
					spanend[--b1] = x;
				}
			}

			t2 = uclip[x];
			b2 = dclip[x];
		}
		if (t2 < b2 && rcolormap != 0)
		{
			R_DrawFogBoundarySection(t2, b2, x1);
		}
	}